

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu_nop_absolute_x_instructions.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_184d01::NopAbsoluteXFixture::~NopAbsoluteXFixture(NopAbsoluteXFixture *this)

{
  code *pcVar1;
  NopAbsoluteXFixture *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

TEST_P(NopAbsoluteXFixture, nop_absx) {
    stage_instruction(GetParam());
    expected.pc += 2;

    EXPECT_CALL(mmu, read_byte(registers.pc + 1)).WillOnce(Return(0x34));
    EXPECT_CALL(mmu, read_byte(registers.pc + 2)).WillOnce(Return(0x12));

    step_execution(4);
    EXPECT_EQ(expected, registers);
}